

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<double> __l;
  bool bVar1;
  _Setprecision _Var2;
  vector<double,_std::allocator<double>_> *pvVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pdVar6;
  double *i_1;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  size_t i;
  allocator<double> local_59;
  double local_58 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> criteria;
  
  criteria.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_58[2] = 4.0;
  local_58[3] = 2.0;
  local_58[0] = 8.0;
  local_58[1] = 5.0;
  local_38 = local_58;
  local_30 = 4;
  std::allocator<double>::allocator(&local_59);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l,&local_59);
  std::allocator<double>::~allocator(&local_59);
  __range1 = (vector<double,_std::allocator<double>_> *)0x0;
  while( true ) {
    pvVar3 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)local_28);
    if (pvVar3 <= __range1) break;
    if (__range1 == (vector<double,_std::allocator<double>_> *)0x0) {
      std::operator<<((ostream *)&std::cout,"Cost: ");
    }
    if (__range1 == (vector<double,_std::allocator<double>_> *)0x1) {
      std::operator<<((ostream *)&std::cout,"Expenses for service: ");
    }
    if (__range1 == (vector<double,_std::allocator<double>_> *)0x2) {
      std::operator<<((ostream *)&std::cout,"Gas consumption: ");
    }
    if (__range1 == (vector<double,_std::allocator<double>_> *)0x3) {
      std::operator<<((ostream *)&std::cout,"Comfort: ");
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_28,(size_type)__range1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __range1 = (vector<double,_std::allocator<double>_> *)
               ((long)&(__range1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  normalize((vector<double,_std::allocator<double>_> *)local_28);
  std::operator<<((ostream *)&std::cout,"Normalized vector { ");
  __end1 = std::vector<double,_std::allocator<double>_>::begin
                     ((vector<double,_std::allocator<double>_> *)local_28);
  i_1 = (double *)
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&i_1);
    if (!bVar1) break;
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    _Var2 = std::setprecision(3);
    poVar5 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pdVar6);
    std::operator<<(poVar5," ");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"}\n");
  setMarks();
  std::operator<<((ostream *)&std::cout,"\n\n\nReplacing criteria with restrictions\n");
  criteria_change();
  std::operator<<((ostream *)&std::cout,"\n\n\nFormation and narrowing of the Parreto set\n");
  Pareto();
  std::operator<<((ostream *)&std::cout,"\n\n\nWeighting and combining criteria\n");
  Enum();
  std::operator<<((ostream *)&std::cout,"\n\n\nHeirarchies\n");
  Hierarchies();
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return criteria.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    vector<double> criteria={8,5,4,2};
    for(size_t i=0;i<criteria.size();i++){
        if(i==0)
            cout << "Cost: ";
        if(i==1)
            cout << "Expenses for service: ";
        if(i==2)
            cout << "Gas consumption: ";
        if(i==3)
            cout << "Comfort: ";
        cout << criteria[i] << endl;
    }
    normalize(criteria);
    cout << "Normalized vector { ";
    for(const double &i : criteria)
        cout << setprecision(3) << i << " ";

    cout << "}\n";

    setMarks();

    cout << "\n\n\nReplacing criteria with restrictions\n";
    criteria_change();

    cout << "\n\n\nFormation and narrowing of the Parreto set\n";
    Pareto();

    cout << "\n\n\nWeighting and combining criteria\n";
    Enum();

    cout << "\n\n\nHeirarchies\n";
    Hierarchies();
}